

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O3

void Aig_ObjCutPrint(Aig_ManCut_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  Aig_Cut_t *pCut;
  
  iVar2 = 0;
  printf("Cuts for node %d:\n",(ulong)(uint)pObj->Id);
  iVar1 = p->nCutsMax;
  if (0 < iVar1) {
    pCut = p->pCuts[pObj->Id];
    do {
      if (pCut->nFanins != '\0') {
        Aig_CutPrint(pCut);
        iVar1 = p->nCutsMax;
      }
      iVar2 = iVar2 + 1;
      pCut = (Aig_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
    } while (iVar2 < iVar1);
  }
  return;
}

Assistant:

void Aig_ObjCutPrint( Aig_ManCut_t * p, Aig_Obj_t * pObj )
{
    Aig_Cut_t * pCut;
    int i;
    printf( "Cuts for node %d:\n", pObj->Id );
    Aig_ObjForEachCut( p, pObj, pCut, i )
        if ( pCut->nFanins )
            Aig_CutPrint( pCut );
//    printf( "\n" );
}